

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask7_24(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  vpmovsxbd_avx(ZEXT416(0x48342410));
  vpmovsxbd_avx(ZEXT416(0x402c1c08));
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[5] << 3)));
  vpmovsxbd_avx(ZEXT416(0x3c281804));
  uVar1 = in[0x13];
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)auVar6._4_4_));
  auVar9 = vpsllvd_avx2(auVar7,_DAT_001a4a30);
  auVar7 = vpgatherdd_avx512vl(*in);
  auVar8 = vpsllvd_avx2(auVar7,_DAT_001a4a50);
  auVar7 = vpinsrd_avx(ZEXT416(*in),auVar6._0_4_ >> 4 | in[5] << 3,1);
  uVar2 = in[0x14];
  auVar7 = vpinsrd_avx(auVar7,auVar6._4_4_ >> 1,2);
  auVar7 = vpinsrd_avx(auVar7,auVar6._8_4_ >> 5 | in[0xe] << 2,3);
  uVar5 = auVar6._12_4_ >> 2;
  auVar8 = vpternlogd_avx512vl(auVar8,auVar9,auVar7,0xfe);
  vpmovsxbd_avx(ZEXT416(0x4430200c));
  uVar3 = in[0x15];
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar5));
  auVar7 = vpsllvd_avx2(auVar7,_DAT_001a4a70);
  auVar9 = vpsllvd_avx2(auVar6,_DAT_001a4a80);
  uVar4 = *(ulong *)(in + 0x16);
  auVar7 = vpternlogd_avx512vl(auVar9,auVar7,auVar8,0xfe);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar4;
  auVar9 = vpsllvd_avx2(auVar9,_DAT_001adbe0);
  *(undefined1 (*) [16])out = auVar7;
  auVar7 = vpinsrd_avx(ZEXT416(uVar3 << 0x13 | uVar2 << 0xc | uVar1 << 5 | uVar5),
                       (uint)(uVar4 >> 6) & 0x3ffffff,1);
  auVar7 = vpor_avx(auVar9,auVar7);
  *(long *)(out + 4) = auVar7._0_8_;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask7_24(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (7 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (7 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (7 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 23;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (7 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 19;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (7 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;

  return out + 1;
}